

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcEdge,_2UL>::Construct
                   (DB *db,LIST *params)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x58);
  puVar1[9] = 0;
  puVar1[10] = "IfcEdge";
  puVar1[5] = 0;
  *puVar1 = 0x7fc9f8;
  puVar1[8] = 0x7fca70;
  puVar1[2] = 0x7fca20;
  puVar1[4] = 0x7fca48;
  puVar1[6] = 0;
  puVar1[7] = 0;
  return (Object *)(puVar1 + 8);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }